

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oneof.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::rust::GenerateOneofAccessors
          (rust *this,Context *ctx,OneofDescriptor *oneof,AccessorCase accessor_case)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  OneofDescriptor *this_00;
  DescriptorStringView this_01;
  Descriptor *containing_type;
  Context *ctx_00;
  undefined4 in_register_0000000c;
  char *pcVar1;
  OneofDescriptor *oneof_00;
  OneofDescriptor *oneof_01;
  string_view sVar2;
  Sub *local_988;
  basic_string_view<char,_std::char_traits<char>_> local_8c0;
  undefined1 local_8a9;
  anon_class_16_2_d925f71f_for_cb local_8a8;
  allocator<char> local_891;
  string local_890;
  anon_class_16_2_1f598b33_for_cb local_870;
  allocator<char> local_859;
  string local_858;
  string local_838;
  allocator<char> local_811;
  string local_810;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  string local_7a8;
  AlphaNum local_788;
  AlphaNum local_758;
  undefined1 local_728 [72];
  basic_string_view<char,_std::char_traits<char>_> local_6e0;
  allocator<char> local_6c9;
  string local_6c8;
  string_view local_6a8;
  allocator<char> local_691;
  string local_690;
  undefined1 local_670 [16];
  string local_660;
  allocator<char> local_629;
  string local_628;
  Sub *local_608;
  Sub local_600;
  Sub local_548;
  Sub local_490;
  Sub local_3d8;
  Sub local_320;
  Sub local_268;
  Sub local_1b0;
  Sub local_f8;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  undefined4 local_1c;
  undefined8 uStack_18;
  AccessorCase accessor_case_local;
  OneofDescriptor *oneof_local;
  Context *ctx_local;
  
  pcVar1 = (char *)CONCAT44(in_register_0000000c,accessor_case);
  local_1c = SUB84(oneof,0);
  local_8a9 = 1;
  local_608 = &local_600;
  uStack_18 = ctx;
  oneof_local = (OneofDescriptor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"oneof_name",&local_629);
  this_01 = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)uStack_18);
  local_670 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
  sVar2._M_len = local_670._8_8_;
  sVar2._M_str = pcVar1;
  RsSafeName_abi_cxx11_(&local_660,local_670._0_8_,sVar2);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_600,&local_628,&local_660);
  local_608 = &local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"view_lifetime",&local_691);
  local_6a8 = ViewLifetime(local_1c);
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_548,&local_690,&local_6a8);
  local_608 = &local_490;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"self",&local_6c9);
  sVar2 = ViewReceiver(local_1c);
  local_6e0._M_str = sVar2._M_str;
  containing_type = (Descriptor *)sVar2._M_len;
  local_6e0._M_len = (size_t)containing_type;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_490,&local_6c8,&local_6e0);
  local_608 = &local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_728 + 0x28),"oneof_enum_module",(allocator<char> *)(local_728 + 0x27))
  ;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_758,"crate::");
  this_00 = oneof_local;
  ctx_00 = (Context *)OneofDescriptor::containing_type((OneofDescriptor *)uStack_18);
  RustModuleForContainingType_abi_cxx11_(&local_7a8,(rust *)this_00,ctx_00,containing_type);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_788,&local_7a8);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_728,&local_758);
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_3d8,(string *)(local_728 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728);
  local_608 = &local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"view_enum_name",&local_7c9);
  OneofViewEnumRsName_abi_cxx11_(&local_7f0,(rust *)uStack_18,oneof_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_320,&local_7c8,&local_7f0);
  local_608 = &local_268;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,"case_enum_name",&local_811);
  OneofCaseEnumRsName_abi_cxx11_(&local_838,(rust *)uStack_18,oneof_01);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_268,&local_810,&local_838);
  local_608 = &local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"view_cases",&local_859);
  local_870.oneof = (OneofDescriptor *)uStack_18;
  local_870.ctx = (Context *)oneof_local;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::rust::GenerateOneofAccessors(google::protobuf::compiler::rust::Context&,google::protobuf::OneofDescriptor_const&,google::protobuf::compiler::rust::AccessorCase)::__0>
            (&local_1b0,&local_858,&local_870);
  local_608 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,"oneof_case_body",&local_891);
  local_8a8.ctx = (Context *)oneof_local;
  local_8a8.oneof = (OneofDescriptor *)uStack_18;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::rust::GenerateOneofAccessors(google::protobuf::compiler::rust::Context&,google::protobuf::OneofDescriptor_const&,google::protobuf::compiler::rust::AccessorCase)::__1>
            (&local_f8,&local_890,&local_8a8);
  local_8a9 = 0;
  local_40 = &local_600;
  local_38 = 8;
  v._M_len = 8;
  v._M_array = local_40;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_30._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_8c0,
             "\n        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {\n          match $self$.$oneof_name$_case() {\n            $view_cases$\n            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)\n          }\n        }\n\n        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {\n          $oneof_case_body$\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  Context::Emit((Context *)this,local_30._M_allocated_capacity,local_30._8_8_,local_8c0._M_len,
                local_8c0._M_str);
  local_988 = (Sub *)&local_40;
  do {
    local_988 = local_988 + -1;
    io::Printer::Sub::~Sub(local_988);
  } while (local_988 != &local_600);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::__cxx11::string::~string((string *)local_728);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)(local_728 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_728 + 0x27));
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  return;
}

Assistant:

void GenerateOneofAccessors(Context& ctx, const OneofDescriptor& oneof,
                            AccessorCase accessor_case) {
  ctx.Emit(
      {{"oneof_name", RsSafeName(oneof.name())},
       {"view_lifetime", ViewLifetime(accessor_case)},
       {"self", ViewReceiver(accessor_case)},
       {"oneof_enum_module",
        absl::StrCat("crate::", RustModuleForContainingType(
                                    ctx, oneof.containing_type()))},
       {"view_enum_name", OneofViewEnumRsName(oneof)},
       {"case_enum_name", OneofCaseEnumRsName(oneof)},
       {"view_cases",
        [&] {
          for (int i = 0; i < oneof.field_count(); ++i) {
            auto& field = *oneof.field(i);
            std::string rs_type = RsTypeNameView(ctx, field);
            if (rs_type.empty()) {
              continue;
            }
            std::string field_name = FieldNameWithCollisionAvoidance(field);
            ctx.Emit(
                {
                    {"case", OneofCaseRsName(field)},
                    {"rs_getter", RsSafeName(field_name)},
                    {"type", rs_type},
                },
                R"rs(
                $oneof_enum_module$$case_enum_name$::$case$ =>
                    $oneof_enum_module$$view_enum_name$::$case$(self.$rs_getter$()),
                )rs");
          }
        }},
       {"oneof_case_body",
        [&] {
          if (ctx.is_cpp()) {
            ctx.Emit({{"case_thunk", ThunkName(ctx, oneof, "case")}},
                     "unsafe { $case_thunk$(self.raw_msg()) }");
          } else {
            ctx.Emit(
                // The field index for an arbitrary field that in the oneof.
                {{"upb_mt_field_index",
                  UpbMiniTableFieldIndex(*oneof.field(0))}},
                R"rs(
                let field_num = unsafe {
                  let f = $pbr$::upb_MiniTable_GetFieldByIndex(
                      <Self as $pbr$::AssociatedMiniTable>::mini_table(),
                      $upb_mt_field_index$);
                  $pbr$::upb_Message_WhichOneofFieldNumber(
                        self.raw_msg(), f)
                };
                unsafe {
                  $oneof_enum_module$$case_enum_name$::try_from(field_num).unwrap_unchecked()
                }
              )rs");
          }
        }}},
      R"rs(
        pub fn $oneof_name$($self$) -> $oneof_enum_module$$view_enum_name$<$view_lifetime$> {
          match $self$.$oneof_name$_case() {
            $view_cases$
            _ => $oneof_enum_module$$view_enum_name$::not_set(std::marker::PhantomData)
          }
        }

        pub fn $oneof_name$_case($self$) -> $oneof_enum_module$$case_enum_name$ {
          $oneof_case_body$
        }
      )rs");
}